

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_iq2_xs(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *pfVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int *piVar11;
  bool bVar12;
  bool bVar13;
  int i;
  long lVar14;
  undefined1 *puVar15;
  ulong uVar16;
  float *pfVar17;
  float *pfVar18;
  char *pcVar19;
  ushort uVar20;
  byte *pbVar21;
  int i_1;
  long lVar22;
  int is;
  int iVar23;
  byte bVar24;
  float *pfVar25;
  ulong *puVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  short sVar36;
  undefined1 auVar42 [12];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined8 uVar41;
  undefined1 auVar43 [16];
  float fVar65;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar54 [16];
  undefined4 uVar67;
  undefined1 auVar55 [16];
  undefined8 uVar68;
  anon_union_4_2_5fd15f10 fp32_2;
  int iVar74;
  int iVar75;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_4_2_5fd15f10 fp32;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int8_t Laux [16];
  int8_t L [16];
  float xval [16];
  float weight [16];
  float waux [16];
  float scales [16];
  byte local_29c;
  byte local_29b;
  undefined1 local_29a;
  undefined1 local_299;
  ushort *local_298;
  uint local_290;
  float local_28c;
  ulong local_288 [4];
  float *local_268;
  long local_260;
  float *local_258;
  long local_250;
  ulong local_248 [2];
  uint16_t *local_238;
  float local_230;
  float local_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float *local_208;
  float *local_200;
  void *local_1f8;
  float *local_1f0;
  float *local_1e8;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  uint64_t *local_1c8;
  long local_1c0;
  long local_1b8;
  int64_t local_1b0;
  long local_1a8;
  float *local_1a0;
  float local_198 [4];
  undefined1 auStack_188 [16];
  float local_178 [8];
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8 [16];
  float local_b8 [16];
  float afStack_78 [18];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined6 uVar40;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 uVar64;
  float fVar66;
  undefined1 auVar84 [16];
  
  local_200 = quant_weights;
  local_1f8 = dst;
  local_268 = src;
  if ((char)n_per_row != '\0') {
    pcVar19 = "n_per_row%QK_K == 0";
    iVar23 = 0xcf8;
LAB_001357d0:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,iVar23,"GGML_ASSERT(%s) failed",pcVar19);
  }
  local_288[3] = n_per_row >> 8;
  if (0 < nrow) {
    local_1c0 = local_288[3] * 0x4a;
    local_208 = src + 1;
    lVar22 = 0;
    local_1b0 = nrow;
    local_1b8 = n_per_row << 2;
    auVar89 = _DAT_0014e950;
    auVar90 = _DAT_0014e750;
    auVar91 = _DAT_0014e720;
    do {
      piVar11 = iq2_data[1].map;
      if (local_200 == (float *)0x0) {
        pcVar19 = "quant_weights && \"missing quantization weights\"";
        iVar23 = 0xc3f;
        goto LAB_001357d0;
      }
      if (iq2_data[1].map == (int *)0x0) {
        pcVar19 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar23 = 0xc40;
        goto LAB_001357d0;
      }
      local_1c8 = iq2_data[1].grid;
      if (iq2_data[1].grid == (uint64_t *)0x0) {
        pcVar19 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar23 = 0xc41;
        goto LAB_001357d0;
      }
      local_238 = iq2_data[1].neighbours;
      if (iq2_data[1].neighbours == (uint16_t *)0x0) {
        pcVar19 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar23 = 0xc42;
        goto LAB_001357d0;
      }
      local_1a8 = lVar22;
      if (0 < (long)local_288[3]) {
        local_238 = iq2_data[1].neighbours + -1;
        local_1e8 = local_208;
        local_1f0 = local_200;
        lVar22 = 0;
        pfVar18 = local_268;
        do {
          lVar14 = lVar22 * 0x4a;
          local_298 = (ushort *)((long)local_1f8 + lVar14);
          *(undefined2 *)((long)local_1f8 + lVar14) = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_128 = 0;
          uStack_120 = 0;
          local_138 = 0;
          uStack_130 = 0;
          *(undefined8 *)((long)local_1f8 + lVar14 + 0x42) = 0;
          local_1a0 = local_268 + lVar22 * 0x100;
          local_28c = 0.0;
          lVar14 = 0;
          do {
            local_28c = local_28c + pfVar18[lVar14] * pfVar18[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x100);
          local_28c = local_28c * 0.00390625;
          fVar38 = 0.0;
          uStack_154 = 0;
          uStack_150 = 0;
          uStack_14c = 0;
          local_1e0 = local_1e8;
          local_1d0 = local_1f0;
          local_1d8 = pfVar18;
          lVar14 = 0;
          local_260 = lVar22;
          local_258 = pfVar18;
          do {
            pfVar18 = local_1a0;
            local_158 = fVar38;
            lVar22 = 0;
            fVar38 = local_28c;
            local_250 = lVar14;
            do {
              fVar37 = local_1d8[lVar22] * local_1d8[lVar22] + fVar38;
              if (fVar37 < 0.0) {
                local_218 = local_1d0[lVar22];
                fVar37 = sqrtf(fVar37);
                auVar89 = _DAT_0014e950;
                auVar90 = _DAT_0014e750;
                auVar91 = _DAT_0014e720;
                fVar66 = local_218;
                fVar38 = local_28c;
              }
              else {
                fVar37 = SQRT(fVar37);
                fVar66 = local_1d0[lVar22];
              }
              local_f8[lVar22] = fVar66 * fVar37;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x10);
            lVar22 = 0;
            do {
              fVar38 = local_f8[lVar22];
              if (fVar38 < 0.0) {
                fVar38 = sqrtf(fVar38);
                auVar89 = _DAT_0014e950;
                auVar90 = _DAT_0014e750;
                auVar91 = _DAT_0014e720;
              }
              else {
                fVar38 = SQRT(fVar38);
              }
              local_b8[lVar22] = fVar38;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x10);
            pbVar21 = &local_29b;
            pfVar17 = local_f8;
            lVar22 = 0;
            pfVar25 = local_198;
            bVar12 = true;
            do {
              bVar13 = bVar12;
              pfVar1 = pfVar18 + lVar14 * 0x10 + lVar22;
              fVar38 = *pfVar1;
              fVar37 = pfVar1[1];
              fVar66 = pfVar1[2];
              fVar77 = pfVar1[3];
              uVar28 = -(uint)(fVar38 < -fVar38);
              uVar30 = -(uint)(fVar37 < -fVar37);
              uVar32 = -(uint)(fVar66 < -fVar66);
              uVar34 = -(uint)(fVar77 < -fVar77);
              auVar43._0_8_ = CONCAT44(uVar30,uVar28);
              auVar43._8_4_ = uVar32;
              auVar43._12_4_ = uVar34;
              auVar87._8_4_ = uVar32;
              auVar87._0_8_ = auVar43._0_8_;
              auVar87._12_4_ = uVar34;
              auVar69 = packssdw(auVar87,auVar43);
              auVar70 = packsswb(auVar69,auVar69);
              auVar43 = auVar43 & _DAT_0014e930;
              *pfVar25 = (float)((uint)-fVar38 & uVar28 | ~uVar28 & (uint)fVar38);
              pfVar25[1] = (float)((uint)-fVar37 & uVar30 | ~uVar30 & (uint)fVar37);
              pfVar25[2] = (float)((uint)-fVar66 & uVar32 | ~uVar32 & (uint)fVar66);
              pfVar25[3] = (float)((uint)-fVar77 & uVar34 | ~uVar34 & (uint)fVar77);
              pfVar25 = pfVar18 + lVar14 * 0x10 + lVar22 + 4;
              fVar38 = *pfVar25;
              fVar37 = pfVar25[1];
              fVar66 = pfVar25[2];
              fVar77 = pfVar25[3];
              uVar28 = (uint)(fVar38 < -fVar38);
              uVar29 = -uVar28;
              uVar30 = (uint)(fVar37 < -fVar37);
              uVar31 = -uVar30;
              uVar32 = (uint)(fVar66 < -fVar66);
              uVar33 = -uVar32;
              uVar34 = (uint)(fVar77 < -fVar77);
              uVar35 = -uVar34;
              auVar86._4_4_ = uVar31;
              auVar86._0_4_ = uVar29;
              auVar86._8_4_ = uVar33;
              auVar86._12_4_ = uVar35;
              auVar80._0_4_ = (uint)-fVar38 & uVar29;
              auVar80._4_4_ = (uint)-fVar37 & uVar31;
              auVar80._8_4_ = (uint)-fVar66 & uVar33;
              auVar80._12_4_ = (uint)-fVar77 & uVar35;
              auVar69._4_4_ = ~uVar31 & (uint)fVar37;
              auVar69._0_4_ = ~uVar29 & (uint)fVar38;
              auVar69._8_4_ = ~uVar33 & (uint)fVar66;
              auVar69._12_4_ = ~uVar35 & (uint)fVar77;
              auVar87 = packssdw(auVar86,auVar86);
              auVar87 = packsswb(auVar87,auVar87);
              auVar87 = auVar87 & _DAT_0014e8d0 | auVar70 & _DAT_0014e8c0;
              *(undefined1 (*) [16])(auStack_188 + lVar22 * 4) = auVar80 | auVar69;
              auVar70._0_4_ = auVar87._0_4_ >> 0x10;
              auVar70._4_4_ = 0;
              auVar70._8_4_ = auVar87._8_4_ >> 0x10;
              auVar70._12_4_ = auVar87._12_4_ >> 0x10;
              bVar24 = SUB161(auVar70 | auVar87,1) | SUB161(auVar70 | auVar87,0);
              if ((auVar43._12_4_ + uVar34 + auVar43._4_4_ + uVar30 +
                   auVar43._8_4_ + uVar32 + auVar43._0_4_ + uVar28 & 1) != 0) {
                fVar38 = *pfVar17 * pfVar18[lVar14 * 0x10 + lVar22] *
                         pfVar18[lVar14 * 0x10 + lVar22];
                uVar16 = 0;
                uVar27 = 1;
                do {
                  fVar37 = local_f8[lVar22 + uVar27] * local_1e0[lVar22 + (uVar27 - 1)] *
                           local_1e0[lVar22 + (uVar27 - 1)];
                  if (fVar37 < fVar38) {
                    uVar16 = uVar27 & 0xffffffff;
                    fVar38 = fVar37;
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != 8);
                iVar23 = (int)lVar22 + (int)uVar16;
                local_198[iVar23] = (float)((uint)local_198[iVar23] ^ (uint)DAT_0014a080);
                bVar24 = bVar24 ^ (byte)(1 << ((byte)uVar16 & 0x1f));
              }
              *pbVar21 = bVar24 & 0x7f;
              lVar22 = 8;
              pbVar21 = &local_29c;
              pfVar17 = local_f8 + 8;
              pfVar25 = local_178;
              bVar12 = false;
            } while (bVar13);
            lVar22 = 1;
            fVar38 = local_198[0];
            do {
              if (fVar38 <= local_198[lVar22]) {
                fVar38 = local_198[lVar22];
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x10);
            if (1e-15 <= fVar38) {
              local_228 = ZEXT416((uint)(fVar38 / 5.0));
              local_148._0_12_ = ZEXT812(0);
              local_148._12_4_ = 0;
              iVar23 = -9;
              local_290 = 0x101;
              local_230 = fVar38;
              do {
                fVar77 = ((float)iVar23 * 0.1 + 5.0) / local_230;
                local_22c = 1.0 / fVar77;
                puVar26 = local_288;
                lVar22 = 0;
                local_218 = fVar77;
                fStack_214 = fVar77;
                fStack_210 = fVar77;
                fStack_20c = fVar77;
                puVar15 = &local_299;
                pfVar18 = local_b8;
                pfVar17 = local_198;
                bVar12 = true;
                fVar38 = fVar77;
                fVar37 = fVar77;
                fVar66 = fVar77;
                do {
                  bVar13 = bVar12;
                  lVar14 = 0;
                  do {
                    pfVar25 = local_198 + lVar22 + lVar14;
                    fVar39 = (*pfVar25 * fVar77 + -1.0) * 0.5 + 12582912.0;
                    fVar65 = (pfVar25[1] * fVar38 + -1.0) * 0.5 + 12582912.0;
                    auVar44._0_8_ = CONCAT44(fVar65,fVar39) & 0x7fffff007fffff;
                    auVar44._8_4_ =
                         (uint)((pfVar25[2] * fVar37 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    auVar44._12_4_ =
                         (uint)((pfVar25[3] * fVar66 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    auVar71._0_4_ = -(uint)((int)((uint)fVar39 & 0x7fffff) < auVar89._0_4_);
                    auVar71._4_4_ = -(uint)((int)((uint)fVar65 & 0x7fffff) < auVar89._4_4_);
                    auVar71._8_4_ = -(uint)((int)auVar44._8_4_ < auVar89._8_4_);
                    auVar71._12_4_ = -(uint)((int)auVar44._12_4_ < auVar89._12_4_);
                    auVar69 = ~auVar71 & auVar89 | auVar44 & auVar71;
                    auVar45._0_4_ = -(uint)(auVar90._0_4_ < auVar69._0_4_);
                    auVar45._4_4_ = -(uint)(auVar90._4_4_ < auVar69._4_4_);
                    auVar45._8_4_ = -(uint)(auVar90._8_4_ < auVar69._8_4_);
                    auVar45._12_4_ = -(uint)(auVar90._12_4_ < auVar69._12_4_);
                    auVar69 = auVar45 & auVar69 & auVar91;
                    sVar6 = auVar69._0_2_;
                    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar69[0] - (0xff < sVar6);
                    sVar6 = auVar69._2_2_;
                    sVar36 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar69[2] - (0xff < sVar6),
                                      cVar2);
                    sVar6 = auVar69._4_2_;
                    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar69[4] - (0xff < sVar6);
                    sVar6 = auVar69._6_2_;
                    uVar67 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar69[6] - (0xff < sVar6),
                                      CONCAT12(cVar3,sVar36));
                    sVar6 = auVar69._8_2_;
                    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar69[8] - (0xff < sVar6);
                    sVar6 = auVar69._10_2_;
                    uVar40 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar69[10] - (0xff < sVar6),
                                      CONCAT14(cVar4,uVar67));
                    sVar6 = auVar69._12_2_;
                    cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar69[0xc] - (0xff < sVar6);
                    sVar8 = auVar69._14_2_;
                    sVar6 = (short)((uint)uVar67 >> 0x10);
                    sVar7 = (short)((uint6)uVar40 >> 0x20);
                    sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar69[0xe] -
                                             (0xff < sVar8),CONCAT16(cVar5,uVar40)) >> 0x30);
                    *(uint *)((long)local_288 + lVar14 + lVar22) =
                         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 -
                                                    (0xff < sVar6),
                                                    (0 < sVar36) * (sVar36 < 0x100) * cVar2 -
                                                    (0xff < sVar36))));
                    lVar14 = lVar14 + 4;
                  } while (lVar14 != 8);
                  uVar16 = *(ulong *)((long)local_288 + lVar22);
                  uVar64 = (undefined1)(uVar16 >> 0x38);
                  auVar53._8_6_ = 0;
                  auVar53._0_8_ = uVar16;
                  auVar53[0xe] = uVar64;
                  auVar53[0xf] = uVar64;
                  uVar64 = (undefined1)(uVar16 >> 0x30);
                  auVar52._14_2_ = auVar53._14_2_;
                  auVar52._8_5_ = 0;
                  auVar52._0_8_ = uVar16;
                  auVar52[0xd] = uVar64;
                  auVar51._13_3_ = auVar52._13_3_;
                  auVar51._8_4_ = 0;
                  auVar51._0_8_ = uVar16;
                  auVar51[0xc] = uVar64;
                  uVar64 = (undefined1)(uVar16 >> 0x28);
                  auVar50._12_4_ = auVar51._12_4_;
                  auVar50._8_3_ = 0;
                  auVar50._0_8_ = uVar16;
                  auVar50[0xb] = uVar64;
                  auVar49._11_5_ = auVar50._11_5_;
                  auVar49._8_2_ = 0;
                  auVar49._0_8_ = uVar16;
                  auVar49[10] = uVar64;
                  uVar64 = (undefined1)(uVar16 >> 0x20);
                  auVar48._10_6_ = auVar49._10_6_;
                  auVar48[8] = 0;
                  auVar48._0_8_ = uVar16;
                  auVar48[9] = uVar64;
                  auVar47._9_7_ = auVar48._9_7_;
                  auVar47[8] = uVar64;
                  auVar47._0_8_ = uVar16;
                  uVar64 = (undefined1)(uVar16 >> 0x18);
                  auVar46._8_8_ = auVar47._8_8_;
                  auVar46[7] = uVar64;
                  auVar46[6] = uVar64;
                  uVar64 = (undefined1)(uVar16 >> 0x10);
                  auVar46[5] = uVar64;
                  auVar46[4] = uVar64;
                  uVar64 = (undefined1)(uVar16 >> 8);
                  auVar46[3] = uVar64;
                  auVar46[2] = uVar64;
                  auVar46[0] = (undefined1)uVar16;
                  auVar46[1] = auVar46[0];
                  auVar69 = psraw(auVar46,8);
                  iVar74 = piVar11[(ushort)(auVar69._14_2_ * 0x4000 | auVar69._6_2_ * 0x40 |
                                            auVar69._10_2_ * 0x400 | auVar69._2_2_ * 4 |
                                           auVar69._12_2_ * 0x1000 | auVar69._4_2_ * 0x10 |
                                           auVar69._8_2_ * 0x100 | auVar69._0_2_)];
                  *puVar15 = 1;
                  if ((long)iVar74 < 0) {
                    *puVar15 = 0;
                    iq2_find_best_neighbour
                              (local_238 + -(long)iVar74,local_1c8,pfVar17,pfVar18,local_22c,
                               (int8_t *)puVar26);
                    auVar89 = _DAT_0014e950;
                    auVar90 = _DAT_0014e750;
                    auVar91 = _DAT_0014e720;
                    fVar77 = local_218;
                    fVar38 = fStack_214;
                    fVar37 = fStack_210;
                    fVar66 = fStack_20c;
                  }
                  puVar26 = local_288 + 1;
                  lVar22 = 8;
                  puVar15 = &local_29a;
                  pfVar18 = local_b8 + 8;
                  pfVar17 = local_178;
                  bVar12 = false;
                } while (bVar13);
                lVar22 = 0;
                auVar69 = (undefined1  [16])0x0;
                do {
                  fVar77 = (float)(*(char *)((long)local_288 + lVar22) * 2 + 1);
                  fVar38 = local_f8[lVar22];
                  fVar37 = auVar69._0_4_ + fVar77 * local_198[lVar22] * fVar38;
                  fVar66 = auVar69._4_4_ + fVar77 * fVar77 * fVar38;
                  auVar54._0_8_ = CONCAT44(fVar66,fVar37);
                  auVar54._8_4_ = auVar69._8_4_ + fVar77 * fVar38 * 0.0;
                  auVar54._12_4_ = auVar69._12_4_ + fVar77 * fVar38 * 0.0;
                  lVar22 = lVar22 + 1;
                  auVar69 = auVar54;
                } while (lVar22 != 0x10);
                if ((0.0 < fVar66) && ((float)local_148._0_4_ * fVar66 < fVar37 * fVar37)) {
                  auVar78._8_4_ = auVar54._8_4_;
                  auVar78._0_8_ = auVar54._0_8_;
                  auVar78._12_4_ = auVar54._12_4_;
                  local_228._4_12_ = auVar78._4_12_;
                  local_228._0_4_ = fVar37 / fVar66;
                  local_248[0] = local_288[0];
                  local_248[1] = local_288[1];
                  local_290 = (uint)CONCAT11(local_29a,local_299);
                  local_148._4_12_ = auVar54._4_12_;
                  local_148._0_4_ = fVar37 * (float)local_228._0_4_;
                }
                iVar23 = iVar23 + 1;
              } while (iVar23 != 10);
              uVar28 = local_290 & 0xffff;
              fVar37 = (float)local_228._0_4_;
              if ((uVar28 < 0x100 || (char)local_290 == '\0') && (0.0 < (float)local_228._0_4_)) {
                fVar77 = 1.0 / (float)local_228._0_4_;
                puVar26 = local_248;
                lVar22 = 0;
                local_218 = fVar77;
                fStack_214 = fVar77;
                fStack_210 = fVar77;
                fStack_20c = fVar77;
                pfVar18 = local_b8;
                pfVar17 = local_198;
                uVar30 = local_290;
                bVar12 = true;
                fVar38 = fVar77;
                fVar37 = fVar77;
                fVar66 = fVar77;
                do {
                  bVar13 = bVar12;
                  if ((uVar30 & 1) == 0) {
                    auVar69 = ZEXT816(0);
                    lVar14 = 0;
                    iVar23 = 0;
                    iVar74 = 1;
                    iVar75 = 2;
                    iVar76 = 3;
                    do {
                      pfVar25 = local_198 + lVar22 + lVar14;
                      fVar77 = (*pfVar25 * fVar77 + -1.0) * 0.5 + 12582912.0;
                      fVar38 = (pfVar25[1] * fVar38 + -1.0) * 0.5 + 12582912.0;
                      auVar81._0_8_ = CONCAT44(fVar38,fVar77) & 0x7fffff007fffff;
                      auVar81._8_4_ =
                           (uint)((pfVar25[2] * fVar37 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar81._12_4_ =
                           (uint)((pfVar25[3] * fVar66 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar79._0_4_ = -(uint)((int)((uint)fVar77 & 0x7fffff) < auVar89._0_4_);
                      auVar79._4_4_ = -(uint)((int)((uint)fVar38 & 0x7fffff) < auVar89._4_4_);
                      auVar79._8_4_ = -(uint)((int)auVar81._8_4_ < auVar89._8_4_);
                      auVar79._12_4_ = -(uint)((int)auVar81._12_4_ < auVar89._12_4_);
                      auVar43 = ~auVar79 & auVar89 | auVar81 & auVar79;
                      auVar82._0_4_ = -(uint)(auVar90._0_4_ < auVar43._0_4_);
                      auVar82._4_4_ = -(uint)(auVar90._4_4_ < auVar43._4_4_);
                      auVar82._8_4_ = -(uint)(auVar90._8_4_ < auVar43._8_4_);
                      auVar82._12_4_ = -(uint)(auVar90._12_4_ < auVar43._12_4_);
                      auVar70 = ~auVar82 & auVar90 | auVar43 & auVar82;
                      auVar88._4_4_ = (int)(float)(iVar74 * 0x1000000 + 0x3f800000);
                      auVar88._12_4_ = (int)(float)(iVar76 * 0x1000000 + 0x3f800000);
                      auVar83._0_4_ = auVar70._0_4_ * (int)(float)(iVar23 * 0x1000000 + 0x3f800000);
                      auVar84._8_4_ =
                           (undefined4)
                           ((auVar70._8_8_ & 0xffffffff) *
                           (ulong)(uint)(int)(float)(iVar75 * 0x1000000 + 0x3f800000));
                      auVar84._4_4_ = auVar84._8_4_;
                      auVar84._0_4_ = auVar83._0_4_;
                      auVar88._0_4_ = auVar88._4_4_;
                      auVar88._8_4_ = auVar88._12_4_;
                      auVar84._12_4_ = (int)((auVar88._8_8_ & 0xffffffff) * (ulong)auVar70._12_4_);
                      auVar83._8_8_ = auVar84._8_8_;
                      auVar83._4_4_ = auVar88._4_4_ * auVar70._4_4_;
                      auVar70 = pshuflw(auVar83,auVar83,0xe8);
                      auVar70 = pshufhw(auVar70,auVar70,0xe8);
                      auVar85._0_4_ = auVar70._0_4_;
                      auVar85._8_4_ = auVar70._8_4_;
                      auVar85._12_4_ = auVar70._12_4_;
                      auVar85._4_4_ = auVar85._8_4_;
                      auVar69 = auVar69 | auVar85;
                      auVar43 = auVar43 & auVar82 & auVar91;
                      sVar6 = auVar43._0_2_;
                      cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar43[0] - (0xff < sVar6);
                      sVar6 = auVar43._2_2_;
                      sVar36 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar43[2] - (0xff < sVar6),
                                        cVar2);
                      sVar6 = auVar43._4_2_;
                      cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar43[4] - (0xff < sVar6);
                      sVar6 = auVar43._6_2_;
                      uVar67 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar43[6] - (0xff < sVar6),
                                        CONCAT12(cVar3,sVar36));
                      sVar6 = auVar43._8_2_;
                      cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar43[8] - (0xff < sVar6);
                      sVar6 = auVar43._10_2_;
                      uVar40 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar43[10] - (0xff < sVar6)
                                        ,CONCAT14(cVar4,uVar67));
                      sVar6 = auVar43._12_2_;
                      cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar43[0xc] - (0xff < sVar6);
                      sVar8 = auVar43._14_2_;
                      sVar6 = (short)((uint)uVar67 >> 0x10);
                      sVar7 = (short)((uint6)uVar40 >> 0x20);
                      sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar43[0xe] -
                                               (0xff < sVar8),CONCAT16(cVar5,uVar40)) >> 0x30);
                      *(uint *)((long)local_248 + lVar14 + lVar22) =
                           CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 -
                                                      (0xff < sVar6),
                                                      (0 < sVar36) * (sVar36 < 0x100) * cVar2 -
                                                      (0xff < sVar36))));
                      lVar14 = lVar14 + 4;
                      iVar23 = iVar23 + 4;
                      iVar74 = iVar74 + 4;
                      iVar75 = iVar75 + 4;
                      iVar76 = iVar76 + 4;
                      fVar77 = local_218;
                      fVar38 = fStack_214;
                      fVar37 = fStack_210;
                      fVar66 = fStack_20c;
                    } while (lVar14 != 8);
                    uVar67 = auVar69._4_4_;
                    auVar72._4_4_ = uVar67;
                    auVar72._0_4_ = uVar67;
                    auVar72._8_4_ = uVar67;
                    auVar72._12_4_ = uVar67;
                    if ((long)piVar11[(ushort)(SUB162(auVar72 | auVar69,2) |
                                              SUB162(auVar72 | auVar69,0))] < 0) {
                      iq2_find_best_neighbour
                                (local_238 +
                                 -(long)piVar11[(ushort)(SUB162(auVar72 | auVar69,2) |
                                                        SUB162(auVar72 | auVar69,0))],local_1c8,
                                 pfVar17,pfVar18,(float)local_228._0_4_,(int8_t *)puVar26);
                      auVar89 = _DAT_0014e950;
                      auVar90 = _DAT_0014e750;
                      auVar91 = _DAT_0014e720;
                      fVar77 = local_218;
                      fVar38 = fStack_214;
                      fVar37 = fStack_210;
                      fVar66 = fStack_20c;
                    }
                  }
                  lVar22 = 8;
                  puVar26 = local_248 + 1;
                  pfVar18 = local_b8 + 8;
                  pfVar17 = local_178;
                  uVar30 = uVar28 >> 8;
                  bVar12 = false;
                } while (bVar13);
                fVar38 = 0.0;
                fVar37 = 0.0;
                lVar22 = 0;
                do {
                  fVar66 = (float)(*(char *)((long)local_248 + lVar22) * 2 + 1);
                  fVar38 = fVar38 + fVar66 * fVar66 * local_f8[lVar22];
                  fVar37 = fVar37 + fVar66 * local_198[lVar22] * local_f8[lVar22];
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 0x10);
                fVar37 = (float)(~-(uint)(0.0 < fVar38) & local_228._0_4_ |
                                (uint)(fVar37 / fVar38) & -(uint)(0.0 < fVar38));
              }
              if (fVar37 < 0.0) {
                local_29b = ~local_29b & 0x7f;
                local_29c = ~local_29c & 0x7f;
                fVar37 = -fVar37;
              }
              pbVar21 = &local_29b;
              uVar16 = 0;
              bVar12 = true;
              do {
                bVar13 = bVar12;
                uVar27 = local_248[uVar16];
                uVar64 = (undefined1)(uVar27 >> 0x38);
                auVar62._8_6_ = 0;
                auVar62._0_8_ = uVar27;
                auVar62[0xe] = uVar64;
                auVar62[0xf] = uVar64;
                uVar64 = (undefined1)(uVar27 >> 0x30);
                auVar61._14_2_ = auVar62._14_2_;
                auVar61._8_5_ = 0;
                auVar61._0_8_ = uVar27;
                auVar61[0xd] = uVar64;
                auVar60._13_3_ = auVar61._13_3_;
                auVar60._8_4_ = 0;
                auVar60._0_8_ = uVar27;
                auVar60[0xc] = uVar64;
                uVar64 = (undefined1)(uVar27 >> 0x28);
                auVar59._12_4_ = auVar60._12_4_;
                auVar59._8_3_ = 0;
                auVar59._0_8_ = uVar27;
                auVar59[0xb] = uVar64;
                auVar58._11_5_ = auVar59._11_5_;
                auVar58._8_2_ = 0;
                auVar58._0_8_ = uVar27;
                auVar58[10] = uVar64;
                uVar64 = (undefined1)(uVar27 >> 0x20);
                auVar57._10_6_ = auVar58._10_6_;
                auVar57[8] = 0;
                auVar57._0_8_ = uVar27;
                auVar57[9] = uVar64;
                auVar56._9_7_ = auVar57._9_7_;
                auVar56[8] = uVar64;
                auVar56._0_8_ = uVar27;
                uVar64 = (undefined1)(uVar27 >> 0x18);
                auVar55._8_8_ = auVar56._8_8_;
                auVar55[7] = uVar64;
                auVar55[6] = uVar64;
                uVar64 = (undefined1)(uVar27 >> 0x10);
                auVar55[5] = uVar64;
                auVar55[4] = uVar64;
                uVar64 = (undefined1)(uVar27 >> 8);
                auVar55[3] = uVar64;
                auVar55[2] = uVar64;
                auVar55[0] = (undefined1)uVar27;
                auVar55[1] = auVar55[0];
                auVar69 = psraw(auVar55,8);
                auVar42._0_2_ = auVar69._0_2_;
                auVar42._2_2_ = auVar69._2_2_ * 4;
                auVar42._4_2_ = auVar69._4_2_ * 0x10;
                auVar42._6_2_ = auVar69._6_2_ * 0x40;
                auVar42._8_2_ = auVar69._8_2_ * 0x100;
                auVar42._10_2_ = auVar69._10_2_ * 0x400;
                auVar63._12_2_ = auVar69._12_2_ * 0x1000;
                auVar63._0_12_ = auVar42;
                auVar63._14_2_ = auVar69._14_2_ * 0x4000;
                auVar73._4_4_ = auVar63._12_4_;
                auVar73._0_4_ = auVar42._8_4_;
                auVar73._8_4_ = auVar42._8_4_;
                auVar73._12_4_ = auVar63._12_4_;
                uVar28 = SUB164(auVar73 | auVar63,4) | SUB164(auVar73 | auVar63,0);
                if (piVar11[uVar28 >> 0x10 | uVar28 & 0xffff] < 0) {
                  printf("Oops: found point %u not on grid:");
                  lVar22 = 0;
                  do {
                    printf(" %d",(ulong)(uint)(int)*(char *)((long)local_248 + lVar22 + uVar16 * 8))
                    ;
                    lVar22 = lVar22 + 1;
                  } while (lVar22 != 8);
                  putchar(10);
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                             ,0xccf,"fatal error");
                }
                *(ushort *)((long)&local_138 + (uVar16 | local_250 * 2) * 2) =
                     (ushort)*pbVar21 << 9 | (ushort)piVar11[uVar28 >> 0x10 | uVar28 & 0xffff];
                uVar16 = 1;
                pbVar21 = &local_29c;
                bVar12 = false;
              } while (bVar13);
              if (fVar37 < 0.0) {
                pcVar19 = "scale >= 0";
                iVar23 = 0xcd3;
                goto LAB_001357d0;
              }
              afStack_78[local_250] = fVar37;
              fVar38 = local_158;
              if (local_158 <= fVar37) {
                fVar38 = fVar37;
              }
            }
            else {
              afStack_78[local_250] = 0.0;
              local_248[0] = 0;
              local_248[1] = 0;
              fVar38 = local_158;
            }
            lVar14 = local_250 + 1;
            local_1d8 = local_1d8 + 0x10;
            local_1d0 = local_1d0 + 0x10;
            local_1e0 = local_1e0 + 0x10;
          } while (lVar14 != 0x10);
          if ((fVar38 != 0.0) || (NAN(fVar38))) {
            fVar38 = fVar38 / 31.0;
            fVar37 = (float)(((uint)fVar38 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar38 * 2) < 0x71000000) {
              fVar37 = 2.0;
            }
            fVar37 = fVar37 + ABS(fVar38) * 5.192297e+33 * 7.70372e-34;
            uVar20 = (SUB42(fVar37,0) & 0xfff) + ((ushort)((uint)fVar37 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar38 * 2)) {
              uVar20 = 0x7e00;
            }
            *local_298 = uVar20 | (ushort)((uint)fVar38 >> 0x10) & 0x8000;
            uVar16 = 0;
            do {
              uVar28 = (uint)((afStack_78[uVar16] * (1.0 / fVar38) + -1.0) * 0.5 + 12582912.0) &
                       0x7fffff;
              if (0x40000e < uVar28) {
                uVar28 = 0x40000f;
              }
              if (uVar28 < 0x400001) {
                uVar28 = 0;
              }
              uVar27 = uVar16 >> 1 & 0x7fffffff;
              if ((uVar16 & 1) == 0) {
                *(char *)((long)local_298 + uVar27 + 0x42) = (char)uVar28;
              }
              else {
                pbVar21 = (byte *)((long)local_298 + uVar27 + 0x42);
                *pbVar21 = *pbVar21 | (char)uVar28 << 4;
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != 0x10);
            auVar9._8_8_ = uStack_120;
            auVar9._0_8_ = local_128;
            auVar10._8_8_ = uStack_100;
            auVar10._0_8_ = local_108;
            *(undefined1 (*) [16])(local_298 + 0x19) = auVar10;
            *(undefined4 *)(local_298 + 0x11) = (undefined4)local_118;
            *(undefined4 *)(local_298 + 0x13) = local_118._4_4_;
            *(undefined4 *)(local_298 + 0x15) = (undefined4)uStack_110;
            *(undefined4 *)(local_298 + 0x17) = uStack_110._4_4_;
            *(undefined1 (*) [16])(local_298 + 9) = auVar9;
            uVar41 = local_138;
            uVar68 = uStack_130;
          }
          else {
            uVar41 = 0;
            uVar68 = 0;
            local_298[0x19] = 0;
            local_298[0x1a] = 0;
            local_298[0x1b] = 0;
            local_298[0x1c] = 0;
            local_298[0x1d] = 0;
            local_298[0x1e] = 0;
            local_298[0x1f] = 0;
            local_298[0x20] = 0;
            local_298[0x11] = 0;
            local_298[0x12] = 0;
            local_298[0x13] = 0;
            local_298[0x14] = 0;
            local_298[0x15] = 0;
            local_298[0x16] = 0;
            local_298[0x17] = 0;
            local_298[0x18] = 0;
            local_298[9] = 0;
            local_298[10] = 0;
            local_298[0xb] = 0;
            local_298[0xc] = 0;
            local_298[0xd] = 0;
            local_298[0xe] = 0;
            local_298[0xf] = 0;
            local_298[0x10] = 0;
          }
          *(undefined8 *)(local_298 + 1) = uVar41;
          *(undefined8 *)(local_298 + 5) = uVar68;
          lVar22 = local_260 + 1;
          pfVar18 = local_258 + 0x100;
          local_1f0 = local_1f0 + 0x100;
          local_1e8 = local_1e8 + 0x100;
        } while (lVar22 != local_288[3]);
      }
      local_268 = (float *)((long)local_268 + local_1b8);
      local_1f8 = (void *)((long)local_1f8 + local_1c0);
      lVar22 = local_1a8 + 1;
      local_208 = (float *)((long)local_208 + local_1b8);
      nrow = local_1b0;
    } while (lVar22 != local_1b0);
  }
  return nrow * local_288[3] * 0x4a;
}

Assistant:

size_t quantize_iq2_xs(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq2_xs_impl(src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq2_xs);
    }
    return nrow * nblock * sizeof(block_iq2_xs);
}